

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O0

pqpair poisson_s2pq(double xx,double lambda)

{
  pqpair pVar1;
  double local_58;
  double bound;
  double xlam;
  double s;
  double q;
  double p;
  int status;
  int which;
  double lambda_local;
  double xx_local;
  pqpair pq;
  
  xx_local = 0.0;
  pq.p = 1.0;
  p._4_4_ = 1;
  q = 0.0;
  s = 1.0;
  if ((0.0 <= xx) && (0.0 <= lambda)) {
    bound = lambda;
    xlam = xx;
    _status = lambda;
    lambda_local = xx;
    cdfpoi((int *)((long)&p + 4),&q,&s,&xlam,&bound,(int *)&p,&local_58);
    xx_local = q;
    pq.p = s;
  }
  pVar1.q = pq.p;
  pVar1.p = xx_local;
  return pVar1;
}

Assistant:

static pqpair poisson_s2pq( double xx , double lambda )
{
   int which , status ;
   double p,q, s,xlam,bound ;
   pqpair pq={0.0,1.0} ;

   which  = 1 ;
   p      = 0.0 ;
   q      = 1.0 ;
   s      = xx ;     if(    s < 0.0 ) return pq ;
   xlam   = lambda ; if( xlam < 0.0 ) return pq ;

   cdfpoi( &which , &p , &q , &s , &xlam , &status , &bound ) ;
   pq.p = p ; pq.q = q ; return pq ;
}